

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

void gl4cts::replaceToken(GLchar *token,GLchar *text,string *string)

{
  char *pcVar1;
  ulong uVar2;
  size_t token_position;
  size_t token_length;
  size_t text_length;
  string *string_local;
  GLchar *text_local;
  GLchar *token_local;
  
  strlen(text);
  pcVar1 = (char *)strlen(token);
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)string,(ulong)token);
    if (uVar2 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)string,uVar2,pcVar1,(ulong)text);
  }
  return;
}

Assistant:

void replaceToken(const GLchar* token, const GLchar* text, std::string& string)
{
	const size_t text_length  = strlen(text);
	const size_t token_length = strlen(token);

	size_t token_position;
	while ((token_position = string.find(token, 0)) != std::string::npos)
	{
		string.replace(token_position, token_length, text, text_length);
	}
}